

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::assign_impl
          (small_vector<int,_4UL,_0UL,_std::allocator<int>_> *this,size_type count,int *value)

{
  int *piVar1;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> *in_RDX;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> *in_RSI;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> *in_RDI;
  size_type i;
  size_t in_stack_ffffffffffffffe0;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> *this_00;
  
  piVar1 = choose_data(in_RDX,in_stack_ffffffffffffffe0);
  in_RDI->m_end = piVar1;
  in_RDI->m_begin = piVar1;
  for (this_00 = (small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)0x0; this_00 < in_RSI;
      this_00 = (small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)&this_00->field_0x1) {
    get_alloc(in_RDI);
    std::allocator_traits<std::allocator<int>>::construct<int,int_const&>
              ((allocator_type *)this_00,(int *)in_RDI,(int *)0x1666d8);
    in_RDI->m_end = in_RDI->m_end + 1;
  }
  update_capacity(this_00);
  return;
}

Assistant:

void assign_impl(size_type count, const T& value)
    {
        assert(m_begin);
        assert(m_begin == m_end);

        m_begin = m_end = choose_data(count);
        for (size_type i = 0; i < count; ++i)
        {
            atraits::construct(get_alloc(), m_end, value);
            ++m_end;
        }

        update_capacity();
    }